

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::SetupFeatureResolution
          (CommandLineInterface *this,DescriptorPool *pool)

{
  atomic<long> aVar1;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 aVar2;
  uint uVar3;
  int iVar4;
  LogMessage *pLVar5;
  FeatureSetDefaults *from;
  char *pcVar6;
  FileDescriptor *pFVar7;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 aVar8;
  pointer v;
  bool bVar9;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view v_00;
  Metadata MVar10;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  Status status;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  feature_extensions;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  Edition in_stack_ffffffffffffff08;
  undefined1 local_f0 [8];
  LogMessage local_e8;
  Descriptor *local_d8;
  iterator iStack_d0;
  DescriptorPool *local_c8;
  _Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
  local_c0;
  _Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false> local_b8;
  pointer local_b0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_a8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_a0;
  size_t local_98;
  FeatureSetDefaults local_68;
  
  local_d8 = (Descriptor *)0x0;
  iStack_d0._M_current = (FieldDescriptor **)0x0;
  local_c8 = (DescriptorPool *)0x0;
  v = (this->output_directives_).
      super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
      ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (this->output_directives_).
             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_c0._M_head_impl =
       (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)pool;
  local_b8._M_head_impl = (Tables *)this;
  if (v != local_b0) {
    do {
      if (v->generator == (CodeGenerator *)0x0) {
        iVar4 = 3;
      }
      else if ((*(char *)&local_b8._M_head_impl[1].misc_allocs_.
                          super__Vector_base<std::unique_ptr<int,_google::protobuf::DescriptorPool::Tables::MiscDeleter>,_std::allocator<std::unique_ptr<int,_google::protobuf::DescriptorPool::Tables::MiscDeleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == '\0') &&
              (uVar3 = (*v->generator->_vptr_CodeGenerator[4])(), (uVar3 & 2) != 0)) {
        iVar4 = (*v->generator->_vptr_CodeGenerator[7])();
        if (iVar4 == 0x3e6) {
          iVar4 = (*v->generator->_vptr_CodeGenerator[8])();
          if (iVar4 == 1000) goto LAB_001d53a9;
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    ((LogMessage *)&local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x608);
          str_05._M_str = "Built-in generator ";
          str_05._M_len = 0x13;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)&local_a8.status_,str_05);
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             ((LogMessage *)&local_a8.status_,&v->name);
          str_06._M_str = " specifies a maximum edition ";
          str_06._M_len = 0x1d;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar5,str_06);
          local_e8.errno_saver_.saved_errno_ = (*v->generator->_vptr_CodeGenerator[8])();
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar5,(Edition *)&local_e8);
          str_07._M_str = " which is not the protoc maximum ";
          str_07._M_len = 0x21;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar5,str_07);
          local_f0._0_4_ = 1000;
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar5,(Edition *)local_f0);
          str_08._M_str = ".";
          str_08._M_len = 1;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar5,str_08);
        }
        else {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    ((LogMessage *)&local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x600);
          str_01._M_str = "Built-in generator ";
          str_01._M_len = 0x13;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)&local_a8.status_,str_01);
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             ((LogMessage *)&local_a8.status_,&v->name);
          str_02._M_str = " specifies a minimum edition ";
          str_02._M_len = 0x1d;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar5,str_02);
          local_e8.errno_saver_.saved_errno_ = (*v->generator->_vptr_CodeGenerator[7])();
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar5,(Edition *)&local_e8);
          str_03._M_str = " which is not the protoc minimum ";
          str_03._M_len = 0x21;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar5,str_03);
          local_f0._0_4_ = 0x3e6;
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::
                   operator<<<google::protobuf::Edition,_0>(pLVar5,(Edition *)local_f0);
          str_04._M_str = ".";
          str_04._M_len = 1;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar5,str_04);
        }
        absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_a8.status_);
        iVar4 = 1;
      }
      else {
LAB_001d53a9:
        (*v->generator->_vptr_CodeGenerator[6])(&local_a8);
        aVar2 = local_a0;
        for (aVar8 = local_a8; aVar8 != aVar2;
            aVar8 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1
                     )((long)aVar8 + 8)) {
          aVar1.super___atomic_base<long>._M_i = *(__atomic_base<long> *)aVar8;
          local_f0 = (undefined1  [8])aVar1.super___atomic_base<long>._M_i;
          if (aVar1.super___atomic_base<long>._M_i == 0) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&local_e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x613);
            str._M_str = "Built-in generator ";
            str._M_len = 0x13;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_e8,str);
            pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_e8,&v->name);
            str_00._M_str = " specifies an unknown feature extension.";
            str_00._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar5,str_00);
            absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_e8);
          }
          else if ((DescriptorPool *)iStack_d0._M_current == local_c8) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_d8,iStack_d0,(FieldDescriptor **)local_f0);
          }
          else {
            *iStack_d0._M_current = (FieldDescriptor *)aVar1.super___atomic_base<long>._M_i;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          if (aVar1.super___atomic_base<long>._M_i == 0) {
            iVar4 = 1;
            goto LAB_001d5474;
          }
        }
        iVar4 = 0;
LAB_001d5474:
        if (local_a8 !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x0) {
          operator_delete((void *)local_a8,local_98 - (long)local_a8);
        }
      }
      if ((iVar4 != 3) && (iVar4 != 0)) {
        bVar9 = false;
        goto LAB_001d56b7;
      }
      v = v + 1;
    } while (v != local_b0);
  }
  MVar10 = FeatureSet::GetMetadata((FeatureSet *)_FeatureSet_default_instance_);
  extensions.ptr_ = (pointer)((long)iStack_d0._M_current - (long)local_d8 >> 3);
  extensions.len_ = 0x3e6;
  FeatureResolver::CompileDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_a8.status_,
             (FeatureResolver *)MVar10.descriptor,local_d8,extensions,EDITION_2024,
             in_stack_ffffffffffffff08);
  bVar9 = local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1;
  if (bVar9) {
    from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::value
                     ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_a8.status_);
    FeatureSetDefaults::FeatureSetDefaults(&local_68,(Arena *)0x0,from);
    DescriptorPool::SetFeatureSetDefaults
              ((DescriptorPool *)local_f0,(FeatureSetDefaults *)local_c0._M_head_impl);
    FeatureSetDefaults::~FeatureSetDefaults(&local_68);
    if (local_f0 != (undefined1  [8])0x1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x623,"status.ok()");
      if (((ulong)local_f0 & 1) == 0) {
        pcVar6 = ((DescriptorNames *)((long)local_f0 + 8))->payload_;
        pFVar7 = *(FileDescriptor **)((long)local_f0 + 0x10);
      }
      else {
        pFVar7 = (FileDescriptor *)(ulong)((uint)(((long)local_f0 << 0x3e) >> 0x3f) & 0x1b);
        pcVar6 = (char *)(((long)local_f0 << 0x3e) >> 0x3f & 0x3e5d70);
      }
      v_00._M_str = pcVar6;
      v_00._M_len = (size_t)pFVar7;
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_e8,v_00);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_e8);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x61f);
    absl::lts_20250127::log_internal::LogMessage::operator<<<absl::lts_20250127::Status,_0>
              (&local_e8,&local_a8.status_);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_e8);
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_a8.status_);
LAB_001d56b7:
  if (local_d8 != (Descriptor *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return bVar9;
}

Assistant:

bool CommandLineInterface::SetupFeatureResolution(DescriptorPool& pool) {
  // Calculate the feature defaults for each built-in generator.  All generators
  // that support editions must agree on the supported edition range.
  std::vector<const FieldDescriptor*> feature_extensions;
  for (const auto& output : output_directives_) {
    if (output.generator == nullptr) continue;
    if (!experimental_editions_ &&
        (output.generator->GetSupportedFeatures() &
         CodeGenerator::FEATURE_SUPPORTS_EDITIONS) != 0) {
      // Only validate min/max edition on generators that advertise editions
      // support.  Generators still under development will always use the
      // correct values.
      if (output.generator->GetMinimumEdition() != ProtocMinimumEdition()) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies a minimum edition "
                        << output.generator->GetMinimumEdition()
                        << " which is not the protoc minimum "
                        << ProtocMinimumEdition() << ".";
        return false;
      }
      if (output.generator->GetMaximumEdition() != ProtocMaximumEdition()) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies a maximum edition "
                        << output.generator->GetMaximumEdition()
                        << " which is not the protoc maximum "
                        << ProtocMaximumEdition() << ".";
        return false;
      }
    }
    for (const FieldDescriptor* ext :
         output.generator->GetFeatureExtensions()) {
      if (ext == nullptr) {
        ABSL_LOG(ERROR) << "Built-in generator " << output.name
                        << " specifies an unknown feature extension.";
        return false;
      }
      feature_extensions.push_back(ext);
    }
  }
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(
          FeatureSet::descriptor(), feature_extensions, ProtocMinimumEdition(),
          MaximumKnownEdition());
  if (!defaults.ok()) {
    ABSL_LOG(ERROR) << defaults.status();
    return false;
  }
  absl::Status status = pool.SetFeatureSetDefaults(std::move(defaults).value());
  ABSL_CHECK(status.ok()) << status.message();
  return true;
}